

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_test.cpp
# Opt level: O2

void juzzlin::StreamTest::testTimestampMode_epochMicroseconds_shouldPrintEpochMicrosecondsTimestamp
               (string *message)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  regex epochMicrosecondsRegex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  stringstream ss;
  ostream local_188 [376];
  
  juzzlin::SimpleLogger::setTimestampMode(EpochMicroseconds);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  juzzlin::SimpleLogger::setStream(Info,local_188);
  juzzlin::SimpleLogger::SimpleLogger((SimpleLogger *)&epochMicrosecondsRegex);
  poVar2 = (ostream *)juzzlin::SimpleLogger::info_abi_cxx11_();
  std::operator<<(poVar2,(string *)message);
  juzzlin::SimpleLogger::~SimpleLogger((SimpleLogger *)&epochMicrosecondsRegex);
  std::__cxx11::stringbuf::str();
  lVar3 = std::__cxx11::string::find((string *)&epochMicrosecondsRegex,(ulong)message);
  if (lVar3 == -1) {
    __assert_fail("ss.str().find(message) != std::string::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]SimpleLogger/src/tests/stream_test/stream_test.cpp"
                  ,300,
                  "void juzzlin::StreamTest::testTimestampMode_epochMicroseconds_shouldPrintEpochMicrosecondsTimestamp(const std::string &)"
                 );
  }
  std::__cxx11::string::~string((string *)&epochMicrosecondsRegex);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&epochMicrosecondsRegex,"\\d{16} ##",0x10);
  std::__cxx11::stringbuf::str();
  bVar1 = std::
          regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (&local_1b8,&epochMicrosecondsRegex,0);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              (&epochMicrosecondsRegex);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return;
  }
  __assert_fail("std::regex_search(ss.str(), epochMicrosecondsRegex)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]SimpleLogger/src/tests/stream_test/stream_test.cpp"
                ,0x130,
                "void juzzlin::StreamTest::testTimestampMode_epochMicroseconds_shouldPrintEpochMicrosecondsTimestamp(const std::string &)"
               );
}

Assistant:

void testTimestampMode_epochMicroseconds_shouldPrintEpochMicrosecondsTimestamp(const std::string & message)
{
    L::setTimestampMode(L::TimestampMode::EpochMicroseconds);
    std::stringstream ss;
    L::setStream(L::Level::Info, ss);
    L().info() << message;
    assert(ss.str().find(message) != std::string::npos);

    // Regex to match epoch microseconds format
    const std::regex epochMicrosecondsRegex(R"(\d{16} ##)");
    assert(std::regex_search(ss.str(), epochMicrosecondsRegex));
}